

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O0

void __thiscall
rapidjson::
GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
::ClearStack(GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
             *this)

{
  Stack<rapidjson::CrtAllocator> *in_RDI;
  
  internal::Stack<rapidjson::CrtAllocator>::Clear
            ((Stack<rapidjson::CrtAllocator> *)&in_RDI->stackEnd_);
  internal::Stack<rapidjson::CrtAllocator>::ShrinkToFit(in_RDI);
  return;
}

Assistant:

void ClearStack() {
        if (Allocator::kNeedFree)
            while (stack_.GetSize() > 0)    // Here assumes all elements in stack array are GenericValue (Member is actually 2 GenericValue objects)
                (stack_.template Pop<ValueType>(1))->~ValueType();
        else
            stack_.Clear();
        stack_.ShrinkToFit();
    }